

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_mem.c
# Opt level: O2

void zt_mem_pools_display(int offset,int flags)

{
  zt_mem_pool *pool;
  zt_elist_t *pzVar1;
  
  printf("%*sPools { \n",(ulong)(uint)(offset * 5),"");
  pzVar1 = &pools;
  while (pool = (zt_mem_pool *)pzVar1->next, pool != (zt_mem_pool *)&pools) {
    zt_mem_pool_display(offset + 1,pool,flags);
    pzVar1 = &pool->pool_list;
  }
  printf("%*s}\n",(ulong)(uint)(offset * 5),"");
  return;
}

Assistant:

void
zt_mem_pools_display(int offset, int flags)
{
    zt_elist_t  * tmp;
    zt_mem_pool * pool;

    printf(BLANK "Pools { \n", INDENT(offset));
    zt_elist_for_each(&pools, tmp) {
        pool = zt_elist_data(tmp, zt_mem_pool, pool_list);
        zt_mem_pool_display(offset + 1, pool, flags);
    }
    printf(BLANK "}\n", INDENT(offset));
}